

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.cpp
# Opt level: O2

Builder * embree::avx::BVH8BuilderTwoLevelVirtualSAH(void *bvh,Scene *scene,bool useMortonBuilder)

{
  BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object> *this;
  
  this = (BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object> *)::operator_new(0xa8);
  BVHNBuilderTwoLevel<8,_embree::UserGeometry,_embree::Object>::BVHNBuilderTwoLevel
            (this,(BVH *)bvh,scene,MTY_USER_GEOMETRY,useMortonBuilder,0x400);
  return (Builder *)this;
}

Assistant:

Builder* BVH8BuilderTwoLevelVirtualSAH (void* bvh, Scene* scene, bool useMortonBuilder) {
      return new BVHNBuilderTwoLevel<8,UserGeometry,Object>((BVH8*)bvh,scene,UserGeometry::geom_type,useMortonBuilder);
    }